

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O3

size_t PAL_wcslen(char16_t *string)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  
  if ((string == (char16_t *)0x0) || (*string == L'\0')) {
    sVar2 = 0;
  }
  else {
    sVar3 = 0;
    do {
      sVar2 = sVar3 + 1;
      lVar1 = sVar3 + 1;
      sVar3 = sVar2;
    } while (string[lVar1] != L'\0');
  }
  return sVar2;
}

Assistant:

__attribute__((no_instrument_function))
size_t
__cdecl
PAL_wcslen(
        const char16_t *string)
{
    size_t nChar = 0;

    // no logging here. PAL's internal output also uses this method

    if ( !string )
    {
        return 0;
    }

    while (*string++)
    {
        nChar++;
    }

    return nChar;
}